

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * util::text_cap(string *__return_storage_ptr__,string *string,int width,string *elipses)

{
  int iVar1;
  ulong uVar2;
  byte *pbVar3;
  char *pcVar4;
  ulong uStack_38;
  int elipses_length;
  size_t i;
  int length;
  string *elipses_local;
  int width_local;
  string *string_local;
  
  i._4_4_ = 0;
  uStack_38 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= uStack_38) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)string);
      return __return_storage_ptr__;
    }
    pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)string);
    i._4_4_ = *(int *)(sizes + (long)(int)(uint)*pbVar3 * 4) + i._4_4_;
    if (width < i._4_4_) break;
    uStack_38 = uStack_38 + 1;
  }
  iVar1 = text_width(elipses);
  for (; width + iVar1 < i._4_4_ && uStack_38 != 0; i._4_4_ = i._4_4_ - *pcVar4) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)string);
    uStack_38 = uStack_38 - 1;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)string);
  return __return_storage_ptr__;
}

Assistant:

std::string text_cap(const std::string& string, int width, const std::string& elipses)
{
	int length = 0;

	for (std::size_t i = 0; i < string.length(); ++i)
	{
		length += sizes[string[i] & 0xFF];

		if (length > width)
		{
			int elipses_length = text_width(elipses);

			while (length > (width + elipses_length) && i > 0)
			{
				length -= string[i];
				--i;
			}

			return string.substr(0, i);
		}
	}

	return string;
}